

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_capacity_suite.cpp
# Opt level: O2

void size_suite::test_u16string(void)

{
  variable data;
  undefined4 local_54;
  size_type local_50;
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  local_48;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&local_48,L"charlie");
  local_50 = trial::dynamic::basic_variable<std::allocator<char>_>::size
                       ((basic_variable<std::allocator<char>_> *)&local_48);
  local_54 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_capacity_suite.cpp"
             ,0x12e,"void size_suite::test_u16string()",&local_50,&local_54);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union(&local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&local_48,L"");
  local_50 = trial::dynamic::basic_variable<std::allocator<char>_>::size
                       ((basic_variable<std::allocator<char>_> *)&local_48);
  local_54 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_capacity_suite.cpp"
             ,0x132,"void size_suite::test_u16string()",&local_50,&local_54);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union(&local_48);
  return;
}

Assistant:

void test_u16string()
{
    {
        variable data(u"charlie");
        TRIAL_PROTOCOL_TEST_EQUAL(data.size(), 1);
    }
    {
        variable data(u"");
        TRIAL_PROTOCOL_TEST_EQUAL(data.size(), 1);
    }
}